

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::setSolution(Highs *this,HighsInt num_entries,HighsInt *index,double *value)

{
  double dVar1;
  uint uVar2;
  Highs *this_00;
  HighsInt *pHVar3;
  ulong uVar4;
  HighsStatus call_status;
  HighsStatus HVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  size_type __n;
  reference rVar9;
  reference rVar10;
  allocator local_169;
  Highs *local_168;
  ulong local_160;
  HighsInt *local_158;
  ulong local_150;
  ulong local_148;
  string local_140;
  vector<bool,_std::allocator<bool>_> is_set;
  HighsSolution new_solution;
  HighsLogOptions local_90;
  
  is_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  is_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  is_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  is_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  is_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  uVar7 = 0;
  local_168 = this;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            (&is_set,(long)(this->model_).lp_.num_col_,false);
  local_150 = (ulong)(uint)num_entries;
  if (num_entries < 1) {
    local_150 = uVar7;
  }
  uVar6 = 0;
  local_158 = index;
  do {
    uVar4 = local_150;
    pHVar3 = local_158;
    if (local_150 == uVar6) {
      if ((int)uVar7 == 0) {
        HVar5 = kOk;
      }
      else {
        pcVar8 = "s";
        if ((int)uVar7 == 1) {
          pcVar8 = "";
        }
        highsLogUser(&(local_168->options_).super_HighsOptionsStruct.log_options,kWarning,
                     "setSolution: User set of indices has %d duplicate%s: last value used\n",uVar7,
                     pcVar8);
        HVar5 = kWarning;
      }
      new_solution.value_valid = false;
      new_solution.dual_valid = false;
      new_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&new_solution.col_value,(long)(local_168->model_).lp_.num_col_,
                 (value_type_conflict1 *)&kHighsUndefined);
      this_00 = local_168;
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        new_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[pHVar3[uVar7]] = value[uVar7];
      }
      HighsLogOptions::HighsLogOptions
                (&local_90,&(local_168->options_).super_HighsOptionsStruct.log_options);
      call_status = setSolution(this_00,&new_solution);
      std::__cxx11::string::string((string *)&local_140,"setSolution",&local_169);
      HVar5 = interpretCallStatus(&local_90,call_status,HVar5,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
      HighsSolution::~HighsSolution(&new_solution);
LAB_00237372:
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&is_set.super__Bvector_base<std::allocator<bool>_>);
      return HVar5;
    }
    uVar2 = local_158[uVar6];
    __n = (size_type)(int)uVar2;
    local_148 = uVar7;
    if (((long)__n < 0) || ((local_168->model_).lp_.num_col_ < (int)uVar2)) {
      highsLogUser(&(local_168->options_).super_HighsOptionsStruct.log_options,kError,
                   "setSolution: User solution index %d has value %d out of range [0, %d)",uVar6,
                   (ulong)uVar2);
LAB_00237287:
      HVar5 = kError;
      goto LAB_00237372;
    }
    dVar1 = (local_168->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
    local_160 = uVar6;
    if ((value[uVar6] <
         (local_168->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[__n] - dVar1) ||
       (dVar1 + (local_168->model_).lp_.col_upper_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[__n] < value[uVar6])) {
      highsLogUser(&(local_168->options_).super_HighsOptionsStruct.log_options,kError,
                   "setSolution: User solution value %d of %g is infeasible for bounds [%g, %g]",
                   uVar6);
      goto LAB_00237287;
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_set,__n);
    uVar7 = *rVar9._M_p;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_set,__n);
    uVar7 = (ulong)(((int)local_148 + 1) - (uint)((uVar7 & rVar9._M_mask) == 0));
    *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    uVar6 = local_160 + 1;
  } while( true );
}

Assistant:

HighsStatus Highs::setSolution(const HighsInt num_entries,
                               const HighsInt* index, const double* value) {
  HighsStatus return_status = HighsStatus::kOk;
  // Warn about duplicates in index
  HighsInt num_duplicates = 0;
  std::vector<bool> is_set;
  is_set.assign(model_.lp_.num_col_, false);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    if (iCol < 0 || iCol > model_.lp_.num_col_) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution index %d has value %d out of "
                   "range [0, %d)",
                   int(iX), int(iCol), int(model_.lp_.num_col_));
      return HighsStatus::kError;
    } else if (value[iX] < model_.lp_.col_lower_[iCol] -
                               options_.primal_feasibility_tolerance ||
               model_.lp_.col_upper_[iCol] +
                       options_.primal_feasibility_tolerance <
                   value[iX]) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution value %d of %g is infeasible "
                   "for bounds [%g, %g]",
                   int(iX), value[iX], model_.lp_.col_lower_[iCol],
                   model_.lp_.col_upper_[iCol]);
      return HighsStatus::kError;
    }
    if (is_set[iCol]) num_duplicates++;
    is_set[iCol] = true;
  }
  if (num_duplicates > 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "setSolution: User set of indices has %d duplicate%s: last "
                 "value used\n",
                 int(num_duplicates), num_duplicates > 1 ? "s" : "");
    return_status = HighsStatus::kWarning;
  }

  // Clear the solution, indicate the values not determined by the
  // user, and insert the values determined by the user
  HighsSolution new_solution;
  new_solution.col_value.assign(model_.lp_.num_col_, kHighsUndefined);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    new_solution.col_value[iCol] = value[iX];
  }
  return interpretCallStatus(options_.log_options, setSolution(new_solution),
                             return_status, "setSolution");
}